

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::LogOpcode
          (BinaryReaderObjdumpDisassemble *this,char *fmt,...)

{
  Opcode *this_00;
  Enum EVar1;
  Offset OVar2;
  ObjdumpOptions *pOVar3;
  ObjdumpState *pOVar4;
  pointer pRVar5;
  ulong uVar6;
  char in_AL;
  bool bVar7;
  size_t sVar8;
  Offset OVar9;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar10;
  ulong uVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  Info local_138;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (this->in_function_body == false) {
    __assert_fail("in_function_body",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-objdump.cc"
                  ,0x295,
                  "void wabt::(anonymous namespace)::BinaryReaderObjdumpDisassemble::LogOpcode(const char *, ...)"
                 );
  }
  if (this->skip_next_opcode_ == true) {
    this->skip_next_opcode_ = false;
  }
  else {
    OVar9 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
            state)->offset;
    OVar2 = this->current_opcode_offset;
    this_00 = &(this->super_BinaryReaderObjdumpBase).current_opcode;
    sVar8 = Opcode::GetLength(this_00);
    uVar14 = this->current_opcode_offset - sVar8;
    uVar13 = this->current_opcode_offset + (OVar9 - OVar2);
    if (uVar14 < uVar13) {
      bVar7 = true;
      do {
        OVar9 = 0;
        if (((this->super_BinaryReaderObjdumpBase).options_)->section_offsets != false) {
          OVar9 = (this->super_BinaryReaderObjdumpBase).section_starts_[10];
        }
        printf(" %06zx:",uVar14 - OVar9);
        uVar11 = 0xffffffffffffffff;
        uVar6 = 0;
        do {
          uVar12 = uVar6;
          uVar11 = uVar11 + 1;
          printf(" %02x",(ulong)(this->super_BinaryReaderObjdumpBase).data_[uVar14]);
          uVar14 = uVar14 + 1;
          if (uVar13 <= uVar14) break;
          uVar6 = uVar12 + 1;
        } while (uVar11 < 8);
        while (uVar11 < 8) {
          printf("   ");
          uVar12 = uVar12 + 1;
          uVar11 = uVar12;
        }
        printf(" | ");
        if (bVar7) {
          EVar1 = (this->super_BinaryReaderObjdumpBase).current_opcode.enum_;
          iVar10 = this->indent_level;
          if ((EVar1 < Drop) && ((0x4000a0U >> (EVar1 & GlobalSet) & 1) != 0)) {
            iVar10 = iVar10 + -1;
          }
          if (0 < iVar10) {
            do {
              printf("  ");
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          Opcode::GetInfo(&local_138,this_00);
          bVar7 = false;
          printf("%s",local_138.name);
          if (fmt != (char *)0x0) {
            putchar(0x20);
            local_138.result_type = (Type)local_e8;
            local_138.decomp = &stack0x00000008;
            local_138.name = (char *)0x3000000010;
            vprintf(fmt,&local_138);
            bVar7 = false;
          }
        }
        putchar(10);
      } while (uVar14 < uVar13);
    }
    pOVar3 = (this->super_BinaryReaderObjdumpBase).options_;
    uVar13 = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate
             .state)->offset;
    this->last_opcode_end = uVar13;
    if (pOVar3->relocs == true) {
      uVar14 = (ulong)this->next_reloc;
      pOVar4 = (this->super_BinaryReaderObjdumpBase).objdump_state_;
      pRVar5 = (pOVar4->code_relocations).
               super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = ((long)(pOVar4->code_relocations).
                      super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pRVar5 >> 3) * -0x5555555555555555;
      if ((uVar14 <= uVar11 && uVar11 - uVar14 != 0) &&
         (OVar9 = pRVar5[uVar14].offset + (this->super_BinaryReaderObjdumpBase).section_starts_[10],
         OVar9 < uVar13)) {
        BinaryReaderObjdumpBase::PrintRelocation
                  (&this->super_BinaryReaderObjdumpBase,pRVar5 + uVar14,OVar9);
        this->next_reloc = this->next_reloc + 1;
      }
    }
  }
  return;
}

Assistant:

void BinaryReaderObjdumpDisassemble::LogOpcode(const char* fmt, ...) {
  // BinaryReaderObjdumpDisassemble is only used to disassembly function bodies
  // so this should never be called for instructions outside of function bodies
  // (i.e. init expresions).
  assert(in_function_body);
  if (skip_next_opcode_) {
    skip_next_opcode_ = false;
    return;
  }
  const Offset immediate_len = state->offset - current_opcode_offset;
  const Offset opcode_size = current_opcode.GetLength();
  const Offset total_size = opcode_size + immediate_len;
  // current_opcode_offset has already read past this opcode; rewind it by the
  // size of this opcode, which may be more than one byte.
  Offset offset = current_opcode_offset - opcode_size;
  const Offset offset_end = offset + total_size;

  bool first_line = true;
  while (offset < offset_end) {
    // Print bytes, but only display a maximum of IMMEDIATE_OCTET_COUNT on each
    // line.
    printf(" %06" PRIzx ":", GetPrintOffset(offset));
    size_t i;
    for (i = 0; offset < offset_end && i < IMMEDIATE_OCTET_COUNT;
         ++i, ++offset) {
      printf(" %02x", data_[offset]);
    }
    // Fill the rest of the remaining space with spaces.
    for (; i < IMMEDIATE_OCTET_COUNT; ++i) {
      printf("   ");
    }
    printf(" | ");

    if (first_line) {
      first_line = false;

      // Print disassembly.
      int indent_level = this->indent_level;
      switch (current_opcode) {
        case Opcode::Else:
        case Opcode::Catch:
        case Opcode::CatchAll:
          indent_level--;
          break;
        default:
          break;
      }
      for (int j = 0; j < indent_level; j++) {
        printf("  ");
      }

      const char* opcode_name = current_opcode.GetName();
      printf("%s", opcode_name);
      if (fmt) {
        printf(" ");
        va_list args;
        va_start(args, fmt);
        vprintf(fmt, args);
        va_end(args);
      }
    }

    printf("\n");
  }

  last_opcode_end = state->offset;

  // Print relocation after then full (potentially multi-line) instruction.
  if (options_->relocs &&
      next_reloc < objdump_state_->code_relocations.size()) {
    const Reloc& reloc = objdump_state_->code_relocations[next_reloc];
    Offset code_start = GetSectionStart(BinarySection::Code);
    Offset abs_offset = code_start + reloc.offset;
    if (last_opcode_end > abs_offset) {
      PrintRelocation(reloc, abs_offset);
      next_reloc++;
    }
  }
}